

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# array_util.c
# Opt level: O0

size_t intersection_uint32(uint32_t *A,size_t lenA,uint32_t *B,size_t lenB,uint32_t *out)

{
  uint32_t *puVar1;
  uint32_t *endB;
  uint32_t *endA;
  uint32_t *initout;
  uint32_t *out_local;
  size_t lenB_local;
  uint32_t *B_local;
  size_t lenA_local;
  uint32_t *A_local;
  
  if ((lenA == 0) || (lenB == 0)) {
    return 0;
  }
  B_local = B;
  A_local = A;
  out_local = out;
  do {
    while (*A_local < *B_local) {
LAB_00117981:
      A_local = A_local + 1;
      if (A_local == A + lenA) {
        return (long)out_local - (long)out >> 2;
      }
    }
    while (*B_local < *A_local) {
      B_local = B_local + 1;
      if (B_local == B + lenB) {
        return (long)out_local - (long)out >> 2;
      }
    }
    if (*A_local != *B_local) goto LAB_00117981;
    puVar1 = out_local + 1;
    *out_local = *A_local;
    A_local = A_local + 1;
    if ((A_local == A + lenA) || (B_local = B_local + 1, out_local = puVar1, B_local == B + lenB)) {
      return (long)puVar1 - (long)out >> 2;
    }
  } while( true );
}

Assistant:

size_t intersection_uint32(const uint32_t *A, const size_t lenA,
                           const uint32_t *B, const size_t lenB,
                           uint32_t *out) {
    const uint32_t *initout = out;
    if (lenA == 0 || lenB == 0) return 0;
    const uint32_t *endA = A + lenA;
    const uint32_t *endB = B + lenB;

    while (1) {
        while (*A < *B) {
        SKIP_FIRST_COMPARE:
            if (++A == endA) return (out - initout);
        }
        while (*A > *B) {
            if (++B == endB) return (out - initout);
        }
        if (*A == *B) {
            *out++ = *A;
            if (++A == endA || ++B == endB) return (out - initout);
        } else {
            goto SKIP_FIRST_COMPARE;
        }
    }
    // return (out - initout);  // NOTREACHED
}